

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O1

void __thiscall DScroller::Serialize(DScroller *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  type_conflict val;
  type_conflict val_1;
  EScroll local_20;
  EScrollPos local_1c;
  
  DObject::Serialize((DObject *)this,arc);
  local_20 = this->m_Type;
  ::Serialize(arc,"type",(int32_t *)&local_20,(int32_t *)0x0);
  this->m_Type = local_20;
  pFVar1 = ::Serialize(arc,"dx",&this->m_dx,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"dy",&this->m_dy,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"affectee",&this->m_Affectee,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"control",&this->m_Control,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"lastheight",&this->m_LastHeight,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"vdx",&this->m_vdx,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"vdy",&this->m_vdy,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"accel",&this->m_Accel,(int32_t *)0x0);
  local_1c = this->m_Parts;
  ::Serialize(pFVar1,"parts",(int32_t *)&local_1c,(int32_t *)0x0);
  this->m_Parts = local_1c;
  FSerializer::Array<TObjPtr<DInterpolation>>
            (pFVar1,"interpolations",this->m_Interpolations,3,false);
  return;
}

Assistant:

void DScroller::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc.Enum("type", m_Type)
		("dx", m_dx)
		("dy", m_dy)
		("affectee", m_Affectee)
		("control", m_Control)
		("lastheight", m_LastHeight)
		("vdx", m_vdx)
		("vdy", m_vdy)
		("accel", m_Accel)
		.Enum("parts", m_Parts)
		.Array("interpolations", m_Interpolations, 3);
}